

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmJoin<cmGraphEdgeList>
                   (string *__return_storage_ptr__,cmGraphEdgeList *rng,string_view separator)

{
  bool bVar1;
  reference pcVar2;
  size_t sVar3;
  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  *__lhs;
  basic_ostream<char,_std::char_traits<char>_> *this;
  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  local_1b0;
  const_iterator end;
  const_iterator it;
  ostringstream os;
  cmGraphEdgeList *rng_local;
  string_view separator_local;
  
  bVar1 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::empty
                    (&rng->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&it);
    end = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin
                    (&rng->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>);
    local_1b0._M_current =
         (cmGraphEdge *)
         std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end
                   (&rng->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>);
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
             ::operator*(&end);
    sVar3 = cmGraphEdge::operator_cast_to_unsigned_long(pcVar2);
    std::ostream::operator<<((ostringstream *)&it,sVar3);
    while( true ) {
      __lhs = __gnu_cxx::
              __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
              ::operator++(&end);
      bVar1 = __gnu_cxx::operator!=(__lhs,&local_1b0);
      if (!bVar1) break;
      this = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&it,separator);
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
               ::operator*(&end);
      sVar3 = cmGraphEdge::operator_cast_to_unsigned_long(pcVar2);
      std::ostream::operator<<(this,sVar3);
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&it);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& rng, cm::string_view separator)
{
  if (rng.empty()) {
    return std::string();
  }

  std::ostringstream os;
  auto it = rng.begin();
  auto const end = rng.end();
  os << *it;
  while (++it != end) {
    os << separator << *it;
  }
  return os.str();
}